

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::Directory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryOpenSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  size_t sVar2;
  Impl *this_00;
  String *pSVar3;
  Own<const_kj::Directory> *pOVar4;
  Directory *pDVar5;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *extraout_RDX_01;
  Directory *extraout_RDX_02;
  Directory *extraout_RDX_03;
  WriteMode in_R8D;
  StringPtr name;
  PathPtr PVar6;
  Maybe<kj::Own<const_kj::Directory>_> MVar7;
  StringPtr local_c0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  OwnOwn<const_kj::Directory> child;
  ArrayPtr<const_char> local_88;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> local_78;
  EntryImpl *local_70;
  EntryImpl *entry;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault f;
  Own<const_kj::(anonymous_namespace)::InMemoryDirectory> local_40;
  undefined4 local_2c;
  InMemoryDirectory *pIStack_28;
  WriteMode mode_local;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (InMemoryDirectory *)path.parts.size_;
  name.content.ptr = (InMemoryDirectory *)path.parts.ptr;
  local_2c = in_R8D;
  pIStack_28 = name.content.ptr;
  path_local.parts.size_ = (size_t)this;
  sVar2 = PathPtr::size((PathPtr *)&this_local);
  if (sVar2 == 0) {
    bVar1 = has<kj::WriteMode,void>(local_2c,MODIFY);
    if (bVar1) {
      atomicAddRef<kj::(anonymous_namespace)::InMemoryDirectory>((kj *)&local_40,name.content.ptr);
      Maybe<kj::Own<kj::Directory_const>>::Maybe<kj::(anonymous_namespace)::InMemoryDirectory_const>
                ((Maybe<kj::Own<kj::Directory_const>> *)this,&local_40);
      Own<const_kj::(anonymous_namespace)::InMemoryDirectory>::~Own(&local_40);
      pDVar5 = extraout_RDX;
    }
    else {
      bVar1 = has<kj::WriteMode,void>(local_2c,CREATE);
      if (bVar1) {
        Maybe<kj::Own<const_kj::Directory>_>::Maybe
                  ((Maybe<kj::Own<const_kj::Directory>_> *)this,(void *)0x0);
        pDVar5 = extraout_RDX_00;
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                  ((Fault *)&lock.ptr,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x495,FAILED,(char *)0x0,"\"can\'t replace self\"",
                   (char (*) [19])"can\'t replace self");
        Maybe<kj::Own<const_kj::Directory>_>::Maybe
                  ((Maybe<kj::Own<const_kj::Directory>_> *)this,(void *)0x0);
        kj::_::Debug::Fault::~Fault((Fault *)&lock.ptr);
        pDVar5 = extraout_RDX_01;
      }
    }
  }
  else {
    sVar2 = PathPtr::size((PathPtr *)&this_local);
    if (sVar2 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      this_00 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                          ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&local_88,pSVar3);
      local_78 = Impl::openEntry(this_00,(StringPtr)local_88,local_2c);
      local_70 = kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                           (&local_78);
      if (local_70 == (EntryImpl *)0x0) {
        Maybe<kj::Own<const_kj::Directory>_>::Maybe
                  ((Maybe<kj::Own<const_kj::Directory>_> *)this,(void *)0x0);
      }
      else {
        asDirectory(this,(Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                         name.content.ptr,(EntryImpl *)&entry,(WriteMode)local_70);
      }
      child.value.ptr._4_4_ = 1;
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      pDVar5 = extraout_RDX_02;
    }
    else {
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_c0,pSVar3);
      name.content.size_ = (size_t)local_c0.content.ptr;
      tryGetParent((InMemoryDirectory *)local_b0,name,(WriteMode)local_c0.content.size_);
      kj::_::readMaybe<kj::Directory_const>
                ((_ *)local_a0,(Maybe<kj::Own<const_kj::Directory>_> *)local_b0);
      Maybe<kj::Own<const_kj::Directory>_>::~Maybe((Maybe<kj::Own<const_kj::Directory>_> *)local_b0)
      ;
      pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_a0);
      if (pOVar4 == (Own<const_kj::Directory> *)0x0) {
        Maybe<kj::Own<const_kj::Directory>_>::Maybe
                  ((Maybe<kj::Own<const_kj::Directory>_> *)this,(void *)0x0);
      }
      else {
        pOVar4 = kj::_::OwnOwn<const_kj::Directory>::operator->
                           ((OwnOwn<const_kj::Directory> *)local_a0);
        pDVar5 = Own<const_kj::Directory>::get(pOVar4);
        sVar2 = PathPtr::size((PathPtr *)&this_local);
        PVar6 = PathPtr::slice((PathPtr *)&this_local,1,sVar2);
        (*(pDVar5->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
                  (this,pDVar5,PVar6.parts.ptr,PVar6.parts.size_,(ulong)(uint)local_2c);
      }
      child.value.ptr._4_4_ = 1;
      kj::_::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_a0);
      pDVar5 = extraout_RDX_03;
    }
  }
  MVar7.ptr.ptr = pDVar5;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        return atomicAddRef(*this);
      } else if (has(mode, WriteMode::CREATE)) {
        return nullptr;  // already exists
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return nullptr; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        return asDirectory(lock, *entry, mode);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->tryOpenSubdir(path.slice(1, path.size()), mode);
      } else {
        return nullptr;
      }
    }
  }